

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void setpaid(monst *shkp)

{
  obj *obj_00;
  bill_x *pbVar1;
  monst *local_20;
  monst *mtmp;
  obj *obj;
  monst *shkp_local;
  
  clear_unpaid(shkp,invent);
  clear_unpaid(shkp,level->objlist);
  clear_unpaid(shkp,level->buriedobjlist);
  if ((thrownobj != (obj *)0x0) && (pbVar1 = onbill(thrownobj,shkp,'\x01'), pbVar1 != (bill_x *)0x0)
     ) {
    *(uint *)&thrownobj->field_0x4a = *(uint *)&thrownobj->field_0x4a & 0xfffffffb;
  }
  for (local_20 = level->monlist; local_20 != (monst *)0x0; local_20 = local_20->nmon) {
    clear_unpaid(shkp,local_20->minvent);
  }
  for (local_20 = migrating_mons; local_20 != (monst *)0x0; local_20 = local_20->nmon) {
    clear_unpaid(shkp,local_20->minvent);
  }
  while (obj_00 = level->billobjs, obj_00 != (obj *)0x0) {
    obj_extract_self(obj_00);
    dealloc_obj(obj_00);
  }
  *(undefined2 *)((long)&shkp[0x1b].misc_worn_check + 2) = 0;
  shkp[0x1b].mappearance = 0;
  *(undefined4 *)&shkp[0x1b].field_0x60 = 0;
  shkp[0x1b].mfleetim = '\0';
  shkp[0x1b].wormno = '\0';
  shkp[0x1b].weapon_check = '\0';
  shkp[0x1b].field_0x67 = 0;
  return;
}

Assistant:

static void setpaid(struct monst *shkp)
{
	struct obj *obj;
	struct monst *mtmp;

	clear_unpaid(shkp, invent);
	clear_unpaid(shkp, level->objlist);
	clear_unpaid(shkp, level->buriedobjlist);
	if (thrownobj && onbill(thrownobj, shkp, TRUE))
		thrownobj->unpaid = 0;
	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon)
		clear_unpaid(shkp, mtmp->minvent);
	for (mtmp = migrating_mons; mtmp; mtmp = mtmp->nmon)
		clear_unpaid(shkp, mtmp->minvent);

	while ((obj = level->billobjs) != 0) {
		obj_extract_self(obj);
		dealloc_obj(obj);
	}
	ESHK(shkp)->billct = 0;
	ESHK(shkp)->credit = 0L;
	ESHK(shkp)->debit = 0L;
	ESHK(shkp)->loan = 0L;
}